

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_self_test(int verbose)

{
  uchar auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  size_t sVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  byte bVar37;
  uchar *data_unit;
  mbedtls_aes_xts_context ctx_xts;
  uchar tmp [16];
  mbedtls_aes_context ctx;
  uchar stream_block [16];
  uchar nonce_counter [16];
  size_t sStack_c0;
  int len;
  size_t offset;
  uchar prv [16];
  uchar iv [16];
  uchar (*local_90) [64];
  uchar *aes_tests;
  uchar buf [64];
  uchar key [32];
  uint keybits;
  int mode;
  int u;
  int j;
  int i;
  int ret;
  int verbose_local;
  
  memset(buf + 0x38,0,0x20);
  mbedtls_aes_init((mbedtls_aes_context *)(tmp + 8));
  for (u = 0; u < 6; u = u + 1) {
    iVar18 = u >> 1;
    uVar19 = iVar18 * 0x40 + 0x80;
    uVar20 = u & 1;
    if (verbose != 0) {
      pcVar21 = "enc";
      if (uVar20 == 0) {
        pcVar21 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)uVar19,pcVar21);
    }
    memset(&aes_tests,0,0x10);
    if (uVar20 == 0) {
      j = mbedtls_aes_setkey_dec((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
      local_90 = (uchar (*) [64])(aes_test_ecb_dec + iVar18);
    }
    else {
      j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
      local_90 = (uchar (*) [64])(aes_test_ecb_enc + iVar18);
    }
    if ((j == -0x72) && (uVar19 == 0xc0)) {
      printf("skipped\n");
    }
    else {
      if (j != 0) goto LAB_00125fac;
      for (mode = 0; mode < 10000; mode = mode + 1) {
        j = mbedtls_aes_crypt_ecb
                      ((mbedtls_aes_context *)(tmp + 8),uVar20,(uchar *)&aes_tests,
                       (uchar *)&aes_tests);
        if (j != 0) goto LAB_00125fac;
      }
      auVar1 = *(uchar (*) [16])local_90;
      cVar22 = -((uchar)aes_tests == auVar1[0]);
      cVar23 = -(aes_tests._1_1_ == auVar1[1]);
      cVar24 = -(aes_tests._2_1_ == auVar1[2]);
      cVar25 = -(aes_tests._3_1_ == auVar1[3]);
      cVar26 = -(aes_tests._4_1_ == auVar1[4]);
      cVar27 = -(aes_tests._5_1_ == auVar1[5]);
      cVar28 = -(aes_tests._6_1_ == auVar1[6]);
      cVar29 = -(aes_tests._7_1_ == auVar1[7]);
      cVar30 = -(buf[0] == auVar1[8]);
      cVar31 = -(buf[1] == auVar1[9]);
      cVar32 = -(buf[2] == auVar1[10]);
      cVar33 = -(buf[3] == auVar1[0xb]);
      cVar34 = -(buf[4] == auVar1[0xc]);
      cVar35 = -(buf[5] == auVar1[0xd]);
      cVar36 = -(buf[6] == auVar1[0xe]);
      bVar37 = -(buf[7] == auVar1[0xf]);
      auVar3[1] = cVar23;
      auVar3[0] = cVar22;
      auVar3[2] = cVar24;
      auVar3[3] = cVar25;
      auVar3[4] = cVar26;
      auVar3[5] = cVar27;
      auVar3[6] = cVar28;
      auVar3[7] = cVar29;
      auVar3[8] = cVar30;
      auVar3[9] = cVar31;
      auVar3[10] = cVar32;
      auVar3[0xb] = cVar33;
      auVar3[0xc] = cVar34;
      auVar3[0xd] = cVar35;
      auVar3[0xe] = cVar36;
      auVar3[0xf] = bVar37;
      auVar4[1] = cVar23;
      auVar4[0] = cVar22;
      auVar4[2] = cVar24;
      auVar4[3] = cVar25;
      auVar4[4] = cVar26;
      auVar4[5] = cVar27;
      auVar4[6] = cVar28;
      auVar4[7] = cVar29;
      auVar4[8] = cVar30;
      auVar4[9] = cVar31;
      auVar4[10] = cVar32;
      auVar4[0xb] = cVar33;
      auVar4[0xc] = cVar34;
      auVar4[0xd] = cVar35;
      auVar4[0xe] = cVar36;
      auVar4[0xf] = bVar37;
      auVar13[1] = cVar25;
      auVar13[0] = cVar24;
      auVar13[2] = cVar26;
      auVar13[3] = cVar27;
      auVar13[4] = cVar28;
      auVar13[5] = cVar29;
      auVar13[6] = cVar30;
      auVar13[7] = cVar31;
      auVar13[8] = cVar32;
      auVar13[9] = cVar33;
      auVar13[10] = cVar34;
      auVar13[0xb] = cVar35;
      auVar13[0xc] = cVar36;
      auVar13[0xd] = bVar37;
      auVar11[1] = cVar26;
      auVar11[0] = cVar25;
      auVar11[2] = cVar27;
      auVar11[3] = cVar28;
      auVar11[4] = cVar29;
      auVar11[5] = cVar30;
      auVar11[6] = cVar31;
      auVar11[7] = cVar32;
      auVar11[8] = cVar33;
      auVar11[9] = cVar34;
      auVar11[10] = cVar35;
      auVar11[0xb] = cVar36;
      auVar11[0xc] = bVar37;
      auVar9[1] = cVar27;
      auVar9[0] = cVar26;
      auVar9[2] = cVar28;
      auVar9[3] = cVar29;
      auVar9[4] = cVar30;
      auVar9[5] = cVar31;
      auVar9[6] = cVar32;
      auVar9[7] = cVar33;
      auVar9[8] = cVar34;
      auVar9[9] = cVar35;
      auVar9[10] = cVar36;
      auVar9[0xb] = bVar37;
      auVar7[1] = cVar28;
      auVar7[0] = cVar27;
      auVar7[2] = cVar29;
      auVar7[3] = cVar30;
      auVar7[4] = cVar31;
      auVar7[5] = cVar32;
      auVar7[6] = cVar33;
      auVar7[7] = cVar34;
      auVar7[8] = cVar35;
      auVar7[9] = cVar36;
      auVar7[10] = bVar37;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar37,CONCAT18(cVar36,CONCAT17(cVar35,CONCAT16(cVar34,
                                                  CONCAT15(cVar33,CONCAT14(cVar32,CONCAT13(cVar31,
                                                  CONCAT12(cVar30,CONCAT11(cVar29,cVar28))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar37,CONCAT17(cVar36,CONCAT16(cVar35,CONCAT15(cVar34,
                                                  CONCAT14(cVar33,CONCAT13(cVar32,CONCAT12(cVar31,
                                                  CONCAT11(cVar30,cVar29)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar37 >> 7) << 0xf) != 0xffff) {
        j = 1;
        goto LAB_00125fac;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
  }
  if (verbose != 0) {
    printf("\n");
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar18 = u >> 1;
    uVar19 = iVar18 * 0x40 + 0x80;
    uVar20 = u & 1;
    if (verbose != 0) {
      pcVar21 = "enc";
      if (uVar20 == 0) {
        pcVar21 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)uVar19,pcVar21);
    }
    memset(prv + 8,0,0x10);
    memset(&offset,0,0x10);
    memset(&aes_tests,0,0x10);
    if (uVar20 == 0) {
      j = mbedtls_aes_setkey_dec((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
      local_90 = (uchar (*) [64])(aes_test_cbc_dec + iVar18);
    }
    else {
      j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
      local_90 = (uchar (*) [64])(aes_test_cbc_enc + iVar18);
    }
    if ((j == -0x72) && (uVar19 == 0xc0)) {
      printf("skipped\n");
    }
    else {
      if (j != 0) goto LAB_00125fac;
      for (mode = 0; uVar16 = prv._0_8_, sVar15 = offset, mode < 10000; mode = mode + 1) {
        if (uVar20 == 1) {
          ctx_xts.tweak.buf[0x42] = (undefined4)offset;
          ctx_xts.tweak.buf[0x43] = offset._4_4_;
          tmp[0] = prv[0];
          tmp[1] = prv[1];
          tmp[2] = prv[2];
          tmp[3] = prv[3];
          tmp[4] = prv[4];
          tmp[5] = prv[5];
          tmp[6] = prv[6];
          tmp[7] = prv[7];
          offset = (size_t)aes_tests;
          prv[0] = buf[0];
          prv[1] = buf[1];
          prv[2] = buf[2];
          prv[3] = buf[3];
          prv[4] = buf[4];
          prv[5] = buf[5];
          prv[6] = buf[6];
          prv[7] = buf[7];
          uVar17 = prv._0_8_;
          aes_tests = (uchar *)sVar15;
          prv[0] = (uchar)uVar16;
          prv[1] = SUB81(uVar16,1);
          prv[2] = SUB81(uVar16,2);
          prv[3] = SUB81(uVar16,3);
          prv[4] = SUB81(uVar16,4);
          prv[5] = SUB81(uVar16,5);
          prv[6] = SUB81(uVar16,6);
          prv[7] = SUB81(uVar16,7);
          buf[0] = prv[0];
          buf[1] = prv[1];
          buf[2] = prv[2];
          buf[3] = prv[3];
          buf[4] = prv[4];
          buf[5] = prv[5];
          buf[6] = prv[6];
          buf[7] = prv[7];
          prv._0_8_ = uVar17;
        }
        j = mbedtls_aes_crypt_cbc
                      ((mbedtls_aes_context *)(tmp + 8),uVar20,0x10,prv + 8,(uchar *)&aes_tests,
                       (uchar *)&aes_tests);
        if (j != 0) goto LAB_00125fac;
      }
      auVar1 = *(uchar (*) [16])local_90;
      cVar22 = -((uchar)aes_tests == auVar1[0]);
      cVar23 = -(aes_tests._1_1_ == auVar1[1]);
      cVar24 = -(aes_tests._2_1_ == auVar1[2]);
      cVar25 = -(aes_tests._3_1_ == auVar1[3]);
      cVar26 = -(aes_tests._4_1_ == auVar1[4]);
      cVar27 = -(aes_tests._5_1_ == auVar1[5]);
      cVar28 = -(aes_tests._6_1_ == auVar1[6]);
      cVar29 = -(aes_tests._7_1_ == auVar1[7]);
      cVar30 = -(buf[0] == auVar1[8]);
      cVar31 = -(buf[1] == auVar1[9]);
      cVar32 = -(buf[2] == auVar1[10]);
      cVar33 = -(buf[3] == auVar1[0xb]);
      cVar34 = -(buf[4] == auVar1[0xc]);
      cVar35 = -(buf[5] == auVar1[0xd]);
      cVar36 = -(buf[6] == auVar1[0xe]);
      bVar37 = -(buf[7] == auVar1[0xf]);
      auVar5[1] = cVar23;
      auVar5[0] = cVar22;
      auVar5[2] = cVar24;
      auVar5[3] = cVar25;
      auVar5[4] = cVar26;
      auVar5[5] = cVar27;
      auVar5[6] = cVar28;
      auVar5[7] = cVar29;
      auVar5[8] = cVar30;
      auVar5[9] = cVar31;
      auVar5[10] = cVar32;
      auVar5[0xb] = cVar33;
      auVar5[0xc] = cVar34;
      auVar5[0xd] = cVar35;
      auVar5[0xe] = cVar36;
      auVar5[0xf] = bVar37;
      auVar6[1] = cVar23;
      auVar6[0] = cVar22;
      auVar6[2] = cVar24;
      auVar6[3] = cVar25;
      auVar6[4] = cVar26;
      auVar6[5] = cVar27;
      auVar6[6] = cVar28;
      auVar6[7] = cVar29;
      auVar6[8] = cVar30;
      auVar6[9] = cVar31;
      auVar6[10] = cVar32;
      auVar6[0xb] = cVar33;
      auVar6[0xc] = cVar34;
      auVar6[0xd] = cVar35;
      auVar6[0xe] = cVar36;
      auVar6[0xf] = bVar37;
      auVar14[1] = cVar25;
      auVar14[0] = cVar24;
      auVar14[2] = cVar26;
      auVar14[3] = cVar27;
      auVar14[4] = cVar28;
      auVar14[5] = cVar29;
      auVar14[6] = cVar30;
      auVar14[7] = cVar31;
      auVar14[8] = cVar32;
      auVar14[9] = cVar33;
      auVar14[10] = cVar34;
      auVar14[0xb] = cVar35;
      auVar14[0xc] = cVar36;
      auVar14[0xd] = bVar37;
      auVar12[1] = cVar26;
      auVar12[0] = cVar25;
      auVar12[2] = cVar27;
      auVar12[3] = cVar28;
      auVar12[4] = cVar29;
      auVar12[5] = cVar30;
      auVar12[6] = cVar31;
      auVar12[7] = cVar32;
      auVar12[8] = cVar33;
      auVar12[9] = cVar34;
      auVar12[10] = cVar35;
      auVar12[0xb] = cVar36;
      auVar12[0xc] = bVar37;
      auVar10[1] = cVar27;
      auVar10[0] = cVar26;
      auVar10[2] = cVar28;
      auVar10[3] = cVar29;
      auVar10[4] = cVar30;
      auVar10[5] = cVar31;
      auVar10[6] = cVar32;
      auVar10[7] = cVar33;
      auVar10[8] = cVar34;
      auVar10[9] = cVar35;
      auVar10[10] = cVar36;
      auVar10[0xb] = bVar37;
      auVar8[1] = cVar28;
      auVar8[0] = cVar27;
      auVar8[2] = cVar29;
      auVar8[3] = cVar30;
      auVar8[4] = cVar31;
      auVar8[5] = cVar32;
      auVar8[6] = cVar33;
      auVar8[7] = cVar34;
      auVar8[8] = cVar35;
      auVar8[9] = cVar36;
      auVar8[10] = bVar37;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar37,CONCAT18(cVar36,CONCAT17(cVar35,CONCAT16(cVar34,
                                                  CONCAT15(cVar33,CONCAT14(cVar32,CONCAT13(cVar31,
                                                  CONCAT12(cVar30,CONCAT11(cVar29,cVar28))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar37,CONCAT17(cVar36,CONCAT16(cVar35,CONCAT15(cVar34,
                                                  CONCAT14(cVar33,CONCAT13(cVar32,CONCAT12(cVar31,
                                                  CONCAT11(cVar30,cVar29)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar37 >> 7) << 0xf) != 0xffff) {
        j = 1;
        goto LAB_00125fac;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
  }
  if (verbose != 0) {
    printf("\n");
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar18 = u >> 1;
    uVar19 = iVar18 * 0x40 + 0x80;
    uVar20 = u & 1;
    if (verbose != 0) {
      pcVar21 = "enc";
      if (uVar20 == 0) {
        pcVar21 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)uVar19,pcVar21);
    }
    prv[8] = '\0';
    prv[9] = '\x01';
    prv[10] = '\x02';
    prv[0xb] = '\x03';
    prv[0xc] = '\x04';
    prv[0xd] = '\x05';
    prv[0xe] = '\x06';
    prv[0xf] = '\a';
    memcpy(buf + 0x38,aes_test_cfb128_key + iVar18,(ulong)(uVar19 >> 3));
    sStack_c0 = 0;
    j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
    if ((j == -0x72) && (uVar19 == 0xc0)) {
      printf("skipped\n");
    }
    else {
      if (j != 0) goto LAB_00125fac;
      if (uVar20 == 0) {
        memcpy(&aes_tests,aes_test_cfb128_ct + iVar18,0x40);
        local_90 = &aes_test_cfb128_pt;
      }
      else {
        memcpy(&aes_tests,aes_test_cfb128_pt,0x40);
        local_90 = aes_test_cfb128_ct + iVar18;
      }
      j = mbedtls_aes_crypt_cfb128
                    ((mbedtls_aes_context *)(tmp + 8),uVar20,0x40,&stack0xffffffffffffff40,prv + 8,
                     (uchar *)&aes_tests,(uchar *)&aes_tests);
      if (j != 0) goto LAB_00125fac;
      iVar18 = memcmp(&aes_tests,local_90,0x40);
      if (iVar18 != 0) {
        j = 1;
        goto LAB_00125fac;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
  }
  if (verbose != 0) {
    printf("\n");
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar18 = u >> 1;
    uVar19 = iVar18 * 0x40 + 0x80;
    if (verbose != 0) {
      pcVar21 = "enc";
      if ((u & 1U) == 0) {
        pcVar21 = "dec";
      }
      printf("  AES-OFB-%3d (%s): ",(ulong)uVar19,pcVar21);
    }
    prv[8] = '\0';
    prv[9] = '\x01';
    prv[10] = '\x02';
    prv[0xb] = '\x03';
    prv[0xc] = '\x04';
    prv[0xd] = '\x05';
    prv[0xe] = '\x06';
    prv[0xf] = '\a';
    memcpy(buf + 0x38,aes_test_ofb_key + iVar18,(ulong)(uVar19 >> 3));
    sStack_c0 = 0;
    j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,uVar19);
    if ((j == -0x72) && (uVar19 == 0xc0)) {
      printf("skipped\n");
    }
    else {
      if (j != 0) goto LAB_00125fac;
      if ((u & 1U) == 0) {
        memcpy(&aes_tests,aes_test_ofb_ct + iVar18,0x40);
        local_90 = &aes_test_ofb_pt;
      }
      else {
        memcpy(&aes_tests,aes_test_ofb_pt,0x40);
        local_90 = aes_test_ofb_ct + iVar18;
      }
      j = mbedtls_aes_crypt_ofb
                    ((mbedtls_aes_context *)(tmp + 8),0x40,&stack0xffffffffffffff40,prv + 8,
                     (uchar *)&aes_tests,(uchar *)&aes_tests);
      if (j != 0) goto LAB_00125fac;
      iVar18 = memcmp(&aes_tests,local_90,0x40);
      if (iVar18 != 0) {
        j = 1;
        goto LAB_00125fac;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
  }
  if (verbose != 0) {
    printf("\n");
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar18 = u >> 1;
    if (verbose != 0) {
      pcVar21 = "enc";
      if ((u & 1U) == 0) {
        pcVar21 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar21);
    }
    stream_block._8_8_ = *(undefined8 *)aes_test_ctr_nonce_counter[iVar18];
    buf._56_8_ = *(undefined8 *)aes_test_ctr_key[iVar18];
    sStack_c0 = 0;
    j = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,0x80);
    if (j != 0) goto LAB_00125fac;
    iVar2 = aes_test_ctr_len[iVar18];
    if ((u & 1U) == 0) {
      memcpy(&aes_tests,aes_test_ctr_ct + iVar18,(long)iVar2);
      local_90 = (uchar (*) [64])(aes_test_ctr_pt + iVar18);
    }
    else {
      memcpy(&aes_tests,aes_test_ctr_pt + iVar18,(long)iVar2);
      local_90 = (uchar (*) [64])(aes_test_ctr_ct + iVar18);
    }
    j = mbedtls_aes_crypt_ctr
                  ((mbedtls_aes_context *)(tmp + 8),(long)iVar2,&stack0xffffffffffffff40,
                   stream_block + 8,(uchar *)(ctx.buf + 0x42),(uchar *)&aes_tests,
                   (uchar *)&aes_tests);
    if (j != 0) goto LAB_00125fac;
    iVar18 = memcmp(&aes_tests,local_90,(long)iVar2);
    if (iVar18 != 0) {
      j = 1;
      goto LAB_00125fac;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf("\n");
  }
  mbedtls_aes_xts_init((mbedtls_aes_xts_context *)&data_unit);
  u = 0;
  do {
    if (5 < u) {
      if (verbose != 0) {
        printf("\n");
      }
      mbedtls_aes_xts_free((mbedtls_aes_xts_context *)&data_unit);
      j = 0;
LAB_00125fac:
      if ((j != 0) && (verbose != 0)) {
        printf("failed\n");
      }
      mbedtls_aes_free((mbedtls_aes_context *)(tmp + 8));
      return j;
    }
    iVar18 = u >> 1;
    if (verbose != 0) {
      printf("  AES-XTS-128 (%s): ");
    }
    memset(buf + 0x38,0,0x20);
    buf._56_8_ = *(undefined8 *)aes_test_xts_key[iVar18];
    if ((u & 1U) == 0) {
      j = mbedtls_aes_xts_setkey_dec((mbedtls_aes_xts_context *)&data_unit,buf + 0x38,0x100);
      if (j != 0) goto LAB_00125fac;
      memcpy(&aes_tests,aes_test_xts_ct32 + iVar18,0x20);
      local_90 = (uchar (*) [64])(aes_test_xts_pt32 + iVar18);
    }
    else {
      j = mbedtls_aes_xts_setkey_enc((mbedtls_aes_xts_context *)&data_unit,buf + 0x38,0x100);
      if (j != 0) goto LAB_00125fac;
      memcpy(&aes_tests,aes_test_xts_pt32 + iVar18,0x20);
      local_90 = (uchar (*) [64])(aes_test_xts_ct32 + iVar18);
    }
    j = mbedtls_aes_crypt_xts
                  ((mbedtls_aes_xts_context *)&data_unit,u & 1U,0x20,aes_test_xts_data_unit[iVar18],
                   (uchar *)&aes_tests,(uchar *)&aes_tests);
    if (j != 0) goto LAB_00125fac;
    iVar18 = memcmp(&aes_tests,local_90,0x20);
    if (iVar18 != 0) {
      j = 1;
      goto LAB_00125fac;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    u = u + 1;
  } while( true );
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB) || \
    defined(MBEDTLS_CIPHER_MODE_OFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_XTS)
    int len;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    /*
     * OFB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-OFB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_ofb_iv, 16 );
        memcpy( key, aes_test_ofb_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ofb_ct[u], 64 );
            aes_tests = aes_test_ofb_pt;
        }
        else
        {
            memcpy( buf, aes_test_ofb_pt, 64 );
            aes_tests = aes_test_ofb_ct[u];
        }

        ret = mbedtls_aes_crypt_ofb( &ctx, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    {
    static const int num_tests =
        sizeof(aes_test_xts_key) / sizeof(*aes_test_xts_key);
    mbedtls_aes_xts_context ctx_xts;

    /*
     * XTS mode
     */
    mbedtls_aes_xts_init( &ctx_xts );

    for( i = 0; i < num_tests << 1; i++ )
    {
        const unsigned char *data_unit;
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-XTS-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( key, 0, sizeof( key ) );
        memcpy( key, aes_test_xts_key[u], 32 );
        data_unit = aes_test_xts_data_unit[u];

        len = sizeof( *aes_test_xts_ct32 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_xts_setkey_dec( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_ct32[u], len );
            aes_tests = aes_test_xts_pt32[u];
        }
        else
        {
            ret = mbedtls_aes_xts_setkey_enc( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_pt32[u], len );
            aes_tests = aes_test_xts_ct32[u];
        }


        ret = mbedtls_aes_crypt_xts( &ctx_xts, mode, len, data_unit,
                                     buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    mbedtls_aes_xts_free( &ctx_xts );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}